

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O0

FNativeTexture * __thiscall FTexture::GetNative(FTexture *this,bool wrapping)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 in_RCX;
  undefined8 in_RDX;
  bool wrapping_local;
  FTexture *this_local;
  
  if (this->Native != (FNativeTexture *)0x0) {
    uVar1 = (*this->Native->_vptr_FNativeTexture[3])
                      (this->Native,(ulong)wrapping & 1,in_RDX,
                       CONCAT71((int7)((ulong)in_RCX >> 8),wrapping) & 0xffffffffffffff01);
    if ((uVar1 & 1) != 0) {
      uVar1 = (*this->_vptr_FTexture[0xd])();
      if ((uVar1 & 1) != 0) {
        (*this->Native->_vptr_FNativeTexture[2])();
      }
      return (FNativeTexture *)(FTexture *)this->Native;
    }
    if (this->Native != (FNativeTexture *)0x0) {
      (*this->Native->_vptr_FNativeTexture[1])();
    }
  }
  iVar2 = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x27])
                    (screen,this,(ulong)wrapping & 1);
  this->Native = (FNativeTexture *)CONCAT44(extraout_var,iVar2);
  return (FNativeTexture *)(FTexture *)this->Native;
}

Assistant:

FNativeTexture *FTexture::GetNative(bool wrapping)
{
	if (Native != NULL)
	{
		if (!Native->CheckWrapping(wrapping))
		{ // Texture's wrapping mode is not compatible.
		  // Destroy it and get a new one.
			delete Native;
		}
		else
		{
			if (CheckModified())
			{
				Native->Update();
			}
			return Native;
		}
	}
	Native = screen->CreateTexture(this, wrapping);
	return Native;
}